

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O2

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_Open
          (IOTHUB_MESSAGING_HANDLE messagingHandle,
          IOTHUB_OPEN_COMPLETE_CALLBACK openCompleteCallback,void *userContextCallback)

{
  SASL_PLAIN_CONFIG *sasl_mechanism_create_parameters;
  char *__s;
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  STRING_HANDLE scope;
  STRING_HANDLE key;
  STRING_HANDLE keyName;
  time_t tVar6;
  STRING_HANDLE handle;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  SASL_MECHANISM_HANDLE pSVar7;
  IO_INTERFACE_DESCRIPTION *pIVar8;
  XIO_HANDLE pXVar9;
  CONNECTION_HANDLE pCVar10;
  SESSION_HANDLE session;
  AMQP_VALUE target;
  LINK_HANDLE pLVar11;
  MESSAGE_SENDER_HANDLE message_sender;
  AMQP_VALUE source;
  AMQP_VALUE target_00;
  MESSAGE_RECEIVER_HANDLE message_receiver;
  IOTHUB_MESSAGING_RESULT IVar12;
  AMQP_VALUE local_90;
  char *local_78;
  char *local_70;
  SASLCLIENTIO_CONFIG sasl_io_config;
  char *local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",0x45f,1,"Input parameter cannot be NULL");
    }
    IVar12 = IOTHUB_MESSAGING_INVALID_ARG;
    target_00 = (AMQP_VALUE)0x0;
    source = (AMQP_VALUE)0x0;
    target = (AMQP_VALUE)0x0;
    local_90 = (AMQP_VALUE)0x0;
    local_78 = (char *)0x0;
    local_70 = (char *)0x0;
    goto LAB_00144c79;
  }
  if (messagingHandle->isOpened != 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",0x464,1,"Messaging is already opened");
    }
    target_00 = (AMQP_VALUE)0x0;
    source = (AMQP_VALUE)0x0;
    target = (AMQP_VALUE)0x0;
    local_90 = (AMQP_VALUE)0x0;
    local_78 = (char *)0x0;
    local_70 = (char *)0x0;
    IVar12 = IOTHUB_MESSAGING_OK;
    goto LAB_00144c79;
  }
  messagingHandle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
  messagingHandle->sasl_mechanism_handle = (SASL_MECHANISM_HANDLE)0x0;
  messagingHandle->sender_link = (LINK_HANDLE)0x0;
  messagingHandle->connection = (CONNECTION_HANDLE)0x0;
  messagingHandle->session = (SESSION_HANDLE)0x0;
  messagingHandle->sasl_io = (XIO_HANDLE)0x0;
  sasl_mechanism_create_parameters = &messagingHandle->sasl_plain_config;
  (messagingHandle->sasl_plain_config).authzid = (char *)0x0;
  messagingHandle->tls_io = (XIO_HANDLE)0x0;
  pcVar5 = messagingHandle->hostname;
  if (pcVar5 == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar5 = "createSendTargetAddress failed - hostname cannot be NULL";
      iVar1 = 0x263;
LAB_00144b9a:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"createSendTargetAddress",iVar1,1,pcVar5);
    }
LAB_00144be2:
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      local_70 = (char *)0x0;
    }
    else {
      local_70 = (char *)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Open",0x474,1,"Could not create sendTargetAddress");
    }
LAB_00144c2a:
    target_00 = (AMQP_VALUE)0x0;
    source = (AMQP_VALUE)0x0;
    target = (AMQP_VALUE)0x0;
    local_90 = (AMQP_VALUE)0x0;
    local_78 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar5);
    local_70 = (char *)malloc(sVar3 + 0x20);
    if (local_70 == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "Malloc failed for sendTargetAddress";
        iVar1 = 0x26d;
        goto LAB_00144b9a;
      }
      goto LAB_00144be2;
    }
    iVar1 = snprintf(local_70,sVar3 + 0x20,"amqps://%s/messages/deviceBound",pcVar5);
    if (iVar1 < 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createSendTargetAddress",0x272,1,"sprintf_s failed for sendTargetAddress.");
      }
      free(local_70);
      goto LAB_00144be2;
    }
    pcVar5 = messagingHandle->hostname;
    if (pcVar5 == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "createReceiveTargetAddress failed - hostname cannot be NULL";
        iVar1 = 0x241;
LAB_00144d22:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createReceiveTargetAddress",iVar1,1,pcVar5);
      }
LAB_00144d68:
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"IoTHubMessaging_LL_Open",0x479,1,"Could not create receiveTargetAddress");
      }
      goto LAB_00144c2a;
    }
    sVar3 = strlen(pcVar5);
    local_78 = (char *)malloc(sVar3 + 0x2a);
    if (local_78 == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "Malloc failed for receiveTargetAddress";
        iVar1 = 0x24b;
        goto LAB_00144d22;
      }
      goto LAB_00144d68;
    }
    iVar1 = snprintf(local_78,sVar3 + 0x2a,"amqps://%s/messages/servicebound/feedback",pcVar5);
    if (iVar1 < 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createReceiveTargetAddress",0x250,1,"sprintf_s failed for receiveTargetAddress."
                 );
      }
      free(local_78);
      goto LAB_00144d68;
    }
    pcVar5 = messagingHandle->iothubName;
    if (pcVar5 == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "createSasPlainConfig failed - iothubName cannot be NULL";
        iVar1 = 0x21d;
LAB_00144e0f:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createAuthCid",iVar1,1,pcVar5);
      }
LAB_00144e58:
      sasl_mechanism_create_parameters->authcid = (char *)0x0;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "Could not create authCid";
        iVar1 = 0x47e;
LAB_00144f5c:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"IoTHubMessaging_LL_Open",iVar1,1,pcVar5);
      }
LAB_00144f65:
      target_00 = (AMQP_VALUE)0x0;
      source = (AMQP_VALUE)0x0;
      target = (AMQP_VALUE)0x0;
      local_90 = (AMQP_VALUE)0x0;
    }
    else {
      __s = messagingHandle->keyName;
      sVar3 = strlen(__s);
      sVar4 = strlen(pcVar5);
      sVar3 = sVar3 + sVar4 + 0xc;
      pcVar5 = (char *)malloc(sVar3);
      if (pcVar5 == (char *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "Malloc failed for authCid.";
          iVar1 = 0x229;
          goto LAB_00144e0f;
        }
        goto LAB_00144e58;
      }
      iVar1 = snprintf(pcVar5,sVar3,"%s@sas.root.%s",__s);
      if (iVar1 < 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createAuthCid",0x22e,1,"sprintf_s failed for authCid.");
        }
        free(pcVar5);
        goto LAB_00144e58;
      }
      (messagingHandle->sasl_plain_config).authcid = pcVar5;
      local_58 = (char *)0x0;
      if (messagingHandle->sharedAccessKey == (char *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "createSasPlainConfig failed - sharedAccessKey cannot be NULL";
          iVar1 = 0x1d1;
LAB_00144f23:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createSasToken",iVar1,1,pcVar5);
        }
LAB_00144f28:
        (messagingHandle->sasl_plain_config).passwd = (char *)0x0;
LAB_00144f2d:
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "Could not create sasToken";
          iVar1 = 0x483;
          goto LAB_00144f5c;
        }
        goto LAB_00144f65;
      }
      if (messagingHandle->hostname == (char *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "createSasPlainConfig failed - hostname cannot be NULL";
          iVar1 = 0x1d6;
          goto LAB_00144f23;
        }
        goto LAB_00144f28;
      }
      if (messagingHandle->keyName == (char *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "createSasPlainConfig failed - keyName cannot be NULL";
          iVar1 = 0x1db;
          goto LAB_00144f23;
        }
        goto LAB_00144f28;
      }
      scope = STRING_construct(messagingHandle->hostname);
      if (scope == (STRING_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "STRING_construct failed for hostName";
          iVar1 = 0x1e6;
LAB_00144fd9:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createSasToken",iVar1,1,pcVar5);
        }
LAB_00144fe2:
        key = (STRING_HANDLE)0x0;
LAB_00144fe5:
        keyName = (STRING_HANDLE)0x0;
        pcVar5 = (char *)0x0;
      }
      else {
        key = STRING_construct(messagingHandle->sharedAccessKey);
        if (key == (STRING_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "STRING_construct failed for sharedAccessKey";
            iVar1 = 0x1eb;
            goto LAB_00144fd9;
          }
          goto LAB_00144fe2;
        }
        keyName = STRING_construct(messagingHandle->keyName);
        if (keyName == (STRING_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"createSasToken",0x1f0,1,"STRING_construct failed for keyName");
          }
          goto LAB_00144fe5;
        }
        tVar6 = time((time_t *)0x0);
        handle = SASToken_Create(key,scope,keyName,tVar6 + 0x1e13380);
        if (handle == (STRING_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "SASToken_Create failed";
            iVar1 = 0x1fc;
            goto LAB_00145089;
          }
LAB_00145090:
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = STRING_c_str(handle);
          if (pcVar5 == (char *)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00145090;
            pcVar5 = "STRING_c_str returned NULL";
            iVar1 = 0x201;
          }
          else {
            iVar1 = mallocAndStrcpy_s(&local_58,pcVar5);
            pcVar5 = local_58;
            if (iVar1 == 0) goto LAB_001450a1;
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00145090;
            pcVar5 = "mallocAndStrcpy_s failed for sharedAccessToken";
            iVar1 = 0x206;
          }
LAB_00145089:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createSasToken",iVar1,1,pcVar5);
          pcVar5 = (char *)0x0;
        }
LAB_001450a1:
        STRING_delete(handle);
      }
      STRING_delete(keyName);
      STRING_delete(key);
      STRING_delete(scope);
      (messagingHandle->sasl_plain_config).passwd = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_00144f2d;
      sasl_mechanism_interface_description = saslplain_get_interface();
      if (sasl_mechanism_interface_description == (SASL_MECHANISM_INTERFACE_DESCRIPTION *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "Could not get SASL plain mechanism interface.";
          iVar1 = 0x48c;
LAB_00145488:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"IoTHubMessaging_LL_Open",iVar1,1,pcVar5);
        }
LAB_00145567:
        target_00 = (AMQP_VALUE)0x0;
        source = (AMQP_VALUE)0x0;
        target = (AMQP_VALUE)0x0;
        local_90 = (AMQP_VALUE)0x0;
      }
      else {
        pSVar7 = saslmechanism_create
                           (sasl_mechanism_interface_description,sasl_mechanism_create_parameters);
        messagingHandle->sasl_mechanism_handle = pSVar7;
        if (pSVar7 == (SASL_MECHANISM_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create SASL plain mechanism.";
            iVar1 = 0x491;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        local_58 = messagingHandle->hostname;
        local_50 = 0x1627;
        local_48 = 0;
        uStack_40 = 0;
        pIVar8 = platform_get_default_tlsio();
        if (pIVar8 == (IO_INTERFACE_DESCRIPTION *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not get default TLS IO interface.";
            iVar1 = 0x49f;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        pXVar9 = xio_create(pIVar8,&local_58);
        messagingHandle->tls_io = pXVar9;
        if (pXVar9 == (XIO_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create TLS IO.";
            iVar1 = 0x4a4;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        if (messagingHandle->trusted_cert != (char *)0x0) {
          iVar1 = xio_setoption(pXVar9,"TrustedCerts",messagingHandle->trusted_cert);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Open",0x4a9,1,"Could set tlsio trusted certificate.");
            }
            xio_destroy(messagingHandle->tls_io);
            messagingHandle->tls_io = (XIO_HANDLE)0x0;
            goto LAB_00145567;
          }
          pXVar9 = messagingHandle->tls_io;
        }
        (messagingHandle->callback_data).openCompleteCompleteCallback = openCompleteCallback;
        (messagingHandle->callback_data).openUserContext = userContextCallback;
        sasl_io_config.sasl_mechanism = messagingHandle->sasl_mechanism_handle;
        sasl_io_config.underlying_io = pXVar9;
        pIVar8 = saslclientio_get_interface_description();
        if (pIVar8 == (IO_INTERFACE_DESCRIPTION *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create get SASL IO interface description.";
            iVar1 = 0x4ba;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        pXVar9 = xio_create(pIVar8,&sasl_io_config);
        messagingHandle->sasl_io = pXVar9;
        if (pXVar9 == (XIO_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create SASL IO.";
            iVar1 = 0x4bf;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        pCVar10 = connection_create(pXVar9,messagingHandle->hostname,"some",(ON_NEW_ENDPOINT)0x0,
                                    (void *)0x0);
        messagingHandle->connection = pCVar10;
        if (pCVar10 == (CONNECTION_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create connection.";
            iVar1 = 0x4c4;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        session = session_create(pCVar10,(ON_LINK_ATTACHED)0x0,(void *)0x0);
        messagingHandle->session = session;
        if (session == (SESSION_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create session.";
            iVar1 = 0x4c9;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        iVar1 = session_set_incoming_window(session,0x7fffffff);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not set incoming window.";
            iVar1 = 0x4ce;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        iVar1 = session_set_outgoing_window(messagingHandle->session,0x3fc00);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not set outgoing window.";
            iVar1 = 0x4d3;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        local_90 = messaging_create_source("ingress");
        if (local_90 == (AMQP_VALUE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create source for link.";
            iVar1 = 0x4d8;
            goto LAB_00145488;
          }
          goto LAB_00145567;
        }
        target = messaging_create_target(local_70);
        if (target == (AMQP_VALUE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Open",0x4dd,1,"Could not create target for link.");
          }
          target_00 = (AMQP_VALUE)0x0;
          source = (AMQP_VALUE)0x0;
          target = (AMQP_VALUE)0x0;
          goto LAB_00145576;
        }
        pLVar11 = link_create(messagingHandle->session,"sender-link",false,local_90,target);
        messagingHandle->sender_link = pLVar11;
        if (pLVar11 == (LINK_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar5 = "Could not create link.";
            iVar1 = 0x4e2;
LAB_001456b4:
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Open",iVar1,1,pcVar5);
          }
LAB_00145834:
          target_00 = (AMQP_VALUE)0x0;
          source = (AMQP_VALUE)0x0;
        }
        else {
          iVar1 = attachServiceClientTypeToLink(pLVar11);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar5 = "Could not set the sender attach properties.";
              iVar1 = 0x4e7;
              goto LAB_001456b4;
            }
            goto LAB_00145834;
          }
          iVar1 = link_set_snd_settle_mode(messagingHandle->sender_link,'\0');
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar5 = "Could not set the sender settle mode.";
              iVar1 = 0x4ec;
              goto LAB_001456b4;
            }
            goto LAB_00145834;
          }
          message_sender =
               messagesender_create
                         (messagingHandle->sender_link,IoTHubMessaging_LL_SenderStateChanged,
                          messagingHandle);
          messagingHandle->message_sender = message_sender;
          if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar5 = "Could not create message sender.";
              iVar1 = 0x4f1;
              goto LAB_001456b4;
            }
            goto LAB_00145834;
          }
          iVar1 = messagesender_open(message_sender);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar5 = "Could not open the message sender.";
              iVar1 = 0x4f6;
              goto LAB_001456b4;
            }
            goto LAB_00145834;
          }
          source = messaging_create_source(local_78);
          if (source == (AMQP_VALUE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar5 = "Could not create source for link.";
              iVar1 = 0x4fb;
              goto LAB_001456b4;
            }
            goto LAB_00145834;
          }
          target_00 = messaging_create_target("receiver_001");
          if (target_00 == (AMQP_VALUE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 == (LOGGER_LOG)0x0) {
              target_00 = (AMQP_VALUE)0x0;
            }
            else {
              target_00 = (AMQP_VALUE)0x0;
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Open",0x500,1,"Could not create target for link.");
            }
          }
          else {
            pLVar11 = link_create(messagingHandle->session,"receiver-link",true,source,target_00);
            messagingHandle->receiver_link = pLVar11;
            if (pLVar11 == (LINK_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                pcVar5 = "Could not create link.";
                iVar1 = 0x505;
LAB_001458e4:
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"IoTHubMessaging_LL_Open",iVar1,1,pcVar5);
              }
            }
            else {
              iVar1 = attachServiceClientTypeToLink(pLVar11);
              if (iVar1 == 0) {
                iVar1 = link_set_rcv_settle_mode(messagingHandle->receiver_link,'\0');
                if (iVar1 == 0) {
                  message_receiver =
                       messagereceiver_create
                                 (messagingHandle->receiver_link,
                                  IoTHubMessaging_LL_ReceiverStateChanged,messagingHandle);
                  messagingHandle->message_receiver = message_receiver;
                  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      pcVar5 = "Could not create message receiver.";
                      iVar1 = 0x514;
                      goto LAB_001458e4;
                    }
                  }
                  else {
                    iVar1 = messagereceiver_open
                                      (message_receiver,IoTHubMessaging_LL_FeedbackMessageReceived,
                                       messagingHandle);
                    if (iVar1 == 0) {
                      messagingHandle->isOpened = 1;
                      IVar12 = IOTHUB_MESSAGING_OK;
                      goto LAB_00144c79;
                    }
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                ,"IoTHubMessaging_LL_Open",0x519,1,
                                "Could not open the message receiver.");
                    }
                    messagereceiver_destroy(messagingHandle->message_receiver);
                    messagingHandle->message_receiver = (MESSAGE_RECEIVER_HANDLE)0x0;
                  }
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    pcVar5 = "Could not set the sender settle mode.";
                    iVar1 = 0x50f;
                    goto LAB_001458e4;
                  }
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  pcVar5 = "Could not create link.";
                  iVar1 = 0x50a;
                  goto LAB_001458e4;
                }
              }
            }
          }
        }
      }
LAB_00145576:
      if (messagingHandle->message_sender != (MESSAGE_SENDER_HANDLE)0x0) {
        messagesender_destroy(messagingHandle->message_sender);
        messagingHandle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
      }
      if (messagingHandle->tls_io != (XIO_HANDLE)0x0) {
        xio_destroy(messagingHandle->tls_io);
        messagingHandle->tls_io = (XIO_HANDLE)0x0;
      }
      if (messagingHandle->sasl_io != (XIO_HANDLE)0x0) {
        xio_destroy(messagingHandle->sasl_io);
        messagingHandle->sasl_io = (XIO_HANDLE)0x0;
      }
      if (messagingHandle->session != (SESSION_HANDLE)0x0) {
        session_destroy(messagingHandle->session);
        messagingHandle->session = (SESSION_HANDLE)0x0;
      }
      pCVar10 = messagingHandle->connection;
      if (pCVar10 != (CONNECTION_HANDLE)0x0) {
        connection_destroy(pCVar10);
        messagingHandle->connection = (CONNECTION_HANDLE)0x0;
      }
      if (messagingHandle->receiver_link != (LINK_HANDLE)0x0) {
        link_destroy(messagingHandle->receiver_link);
        messagingHandle->receiver_link = (LINK_HANDLE)0x0;
      }
    }
  }
  if (sasl_mechanism_create_parameters->authcid != (char *)0x0) {
    free(sasl_mechanism_create_parameters->authcid);
    sasl_mechanism_create_parameters->authcid = (char *)0x0;
  }
  pcVar5 = (messagingHandle->sasl_plain_config).passwd;
  IVar12 = IOTHUB_MESSAGING_ERROR;
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
    (messagingHandle->sasl_plain_config).passwd = (char *)0x0;
  }
LAB_00144c79:
  amqpvalue_destroy(local_90);
  amqpvalue_destroy(target);
  amqpvalue_destroy(source);
  amqpvalue_destroy(target_00);
  free(local_70);
  free(local_78);
  return IVar12;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_Open(IOTHUB_MESSAGING_HANDLE messagingHandle, IOTHUB_OPEN_COMPLETE_CALLBACK openCompleteCallback, void* userContextCallback)
{
    IOTHUB_MESSAGING_RESULT result;

    char* send_target_address = NULL;
    char* receive_target_address = NULL;

    TLSIO_CONFIG tls_io_config;
    SASLCLIENTIO_CONFIG sasl_io_config;

    AMQP_VALUE sendSource = NULL;
    AMQP_VALUE sendTarget = NULL;

    AMQP_VALUE receiveSource = NULL;
    AMQP_VALUE receiveTarget = NULL;

    if (messagingHandle == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (messagingHandle->isOpened != 0)
    {
        LogError("Messaging is already opened");
        result = IOTHUB_MESSAGING_OK;
    }
    else
    {
        messagingHandle->message_sender = NULL;
        messagingHandle->connection = NULL;
        messagingHandle->session = NULL;
        messagingHandle->sender_link = NULL;
        messagingHandle->sasl_plain_config.authzid = NULL;
        messagingHandle->sasl_mechanism_handle = NULL;
        messagingHandle->tls_io = NULL;
        messagingHandle->sasl_io = NULL;

        if ((send_target_address = createSendTargetAddress(messagingHandle)) == NULL)
        {
            LogError("Could not create sendTargetAddress");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((receive_target_address = createReceiveTargetAddress(messagingHandle)) == NULL)
        {
            LogError("Could not create receiveTargetAddress");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((messagingHandle->sasl_plain_config.authcid = createAuthCid(messagingHandle)) == NULL)
        {
            LogError("Could not create authCid");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else if ((messagingHandle->sasl_plain_config.passwd = createSasToken(messagingHandle)) == NULL)
        {
            LogError("Could not create sasToken");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            const SASL_MECHANISM_INTERFACE_DESCRIPTION* sasl_mechanism_interface;

            if ((sasl_mechanism_interface = saslplain_get_interface()) == NULL)
            {
                LogError("Could not get SASL plain mechanism interface.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else if ((messagingHandle->sasl_mechanism_handle = saslmechanism_create(sasl_mechanism_interface, &messagingHandle->sasl_plain_config)) == NULL)
            {
                LogError("Could not create SASL plain mechanism.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else
            {
                tls_io_config.hostname = messagingHandle->hostname;
                tls_io_config.port = 5671;
                tls_io_config.underlying_io_interface = NULL;
                tls_io_config.underlying_io_parameters = NULL;

                const IO_INTERFACE_DESCRIPTION* tlsio_interface;

                if ((tlsio_interface = platform_get_default_tlsio()) == NULL)
                {
                    LogError("Could not get default TLS IO interface.");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else if ((messagingHandle->tls_io = xio_create(tlsio_interface, &tls_io_config)) == NULL)
                {
                    LogError("Could not create TLS IO.");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else if (messagingHandle->trusted_cert != NULL && xio_setoption(messagingHandle->tls_io, OPTION_TRUSTED_CERT, messagingHandle->trusted_cert) != 0)
                {
                    LogError("Could set tlsio trusted certificate.");
                    xio_destroy(messagingHandle->tls_io);
                    messagingHandle->tls_io = NULL;
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else
                {
                    messagingHandle->callback_data.openCompleteCompleteCallback = openCompleteCallback;
                    messagingHandle->callback_data.openUserContext = userContextCallback;

                    sasl_io_config.sasl_mechanism = messagingHandle->sasl_mechanism_handle;
                    sasl_io_config.underlying_io = messagingHandle->tls_io;

                    const IO_INTERFACE_DESCRIPTION* saslclientio_interface;

                    if ((saslclientio_interface = saslclientio_get_interface_description()) == NULL)
                    {
                        LogError("Could not create get SASL IO interface description.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->sasl_io = xio_create(saslclientio_interface, &sasl_io_config)) == NULL)
                    {
                        LogError("Could not create SASL IO.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->connection = connection_create(messagingHandle->sasl_io, messagingHandle->hostname, "some", NULL, NULL)) == NULL)
                    {
                        LogError("Could not create connection.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->session = session_create(messagingHandle->connection, NULL, NULL)) == NULL)
                    {
                        LogError("Could not create session.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (session_set_incoming_window(messagingHandle->session, 2147483647) != 0)
                    {
                        LogError("Could not set incoming window.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (session_set_outgoing_window(messagingHandle->session, 255 * 1024) != 0)
                    {
                        LogError("Could not set outgoing window.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((sendSource = messaging_create_source("ingress")) == NULL)
                    {
                        LogError("Could not create source for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((sendTarget = messaging_create_target(send_target_address)) == NULL)
                    {
                        LogError("Could not create target for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->sender_link = link_create(messagingHandle->session, "sender-link", role_sender, sendSource, sendTarget)) == NULL)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (attachServiceClientTypeToLink(messagingHandle->sender_link) != 0)
                    {
                        LogError("Could not set the sender attach properties.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (link_set_snd_settle_mode(messagingHandle->sender_link, sender_settle_mode_unsettled) != 0)
                    {
                        LogError("Could not set the sender settle mode.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->message_sender = messagesender_create(messagingHandle->sender_link, IoTHubMessaging_LL_SenderStateChanged, messagingHandle)) == NULL)
                    {
                        LogError("Could not create message sender.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (messagesender_open(messagingHandle->message_sender) != 0)
                    {
                        LogError("Could not open the message sender.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((receiveSource = messaging_create_source(receive_target_address)) == NULL)
                    {
                        LogError("Could not create source for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((receiveTarget = messaging_create_target("receiver_001")) == NULL)
                    {
                        LogError("Could not create target for link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->receiver_link = link_create(messagingHandle->session, "receiver-link", role_receiver, receiveSource, receiveTarget)) == NULL)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (attachServiceClientTypeToLink(messagingHandle->receiver_link) != 0)
                    {
                        LogError("Could not create link.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (link_set_rcv_settle_mode(messagingHandle->receiver_link, receiver_settle_mode_first) != 0)
                    {
                        LogError("Could not set the sender settle mode.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if ((messagingHandle->message_receiver = messagereceiver_create(messagingHandle->receiver_link, IoTHubMessaging_LL_ReceiverStateChanged, messagingHandle)) == NULL)
                    {
                        LogError("Could not create message receiver.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (messagereceiver_open(messagingHandle->message_receiver, IoTHubMessaging_LL_FeedbackMessageReceived, messagingHandle) != 0)
                    {
                        LogError("Could not open the message receiver.");
                        messagereceiver_destroy(messagingHandle->message_receiver);
                        messagingHandle->message_receiver = NULL;
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else
                    {
                        messagingHandle->isOpened = true;
                        result = IOTHUB_MESSAGING_OK;
                    }
                }
            }
            if (result != IOTHUB_MESSAGING_OK)
            {
                if (messagingHandle->message_sender != NULL)
                {
                    messagesender_destroy(messagingHandle->message_sender);
                    messagingHandle->message_sender = NULL;
                }
                if (messagingHandle->tls_io != NULL)
                {
                    xio_destroy(messagingHandle->tls_io);
                    messagingHandle->tls_io = NULL;
                }
                if (messagingHandle->sasl_io != NULL)
                {
                    xio_destroy(messagingHandle->sasl_io);
                    messagingHandle->sasl_io = NULL;
                }
                if (messagingHandle->session != NULL)
                {
                    session_destroy(messagingHandle->session);
                    messagingHandle->session = NULL;
                }
                if (messagingHandle->connection != NULL)
                {
                    connection_destroy(messagingHandle->connection);
                    messagingHandle->connection = NULL;
                }
                if (messagingHandle->receiver_link != NULL)
                {
                    link_destroy(messagingHandle->receiver_link);
                    messagingHandle->receiver_link = NULL;
                }
            }
        }
        if (result != IOTHUB_MESSAGING_OK)
        {
            if (messagingHandle->sasl_plain_config.authcid != NULL)
            {
                free((char*)messagingHandle->sasl_plain_config.authcid);
                messagingHandle->sasl_plain_config.authcid = NULL;
            }
            if (messagingHandle->sasl_plain_config.passwd != NULL)
            {
                free((char*)messagingHandle->sasl_plain_config.passwd);
                messagingHandle->sasl_plain_config.passwd = NULL;
            }
        }
    }
    amqpvalue_destroy(sendSource);
    amqpvalue_destroy(sendTarget);
    amqpvalue_destroy(receiveSource);
    amqpvalue_destroy(receiveTarget);

    if (send_target_address != NULL)
    {
        free(send_target_address);
    }
    if (receive_target_address != NULL)
    {
        free(receive_target_address);
    }
    return result;
}